

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O3

void __thiscall tvm::runtime::TVMRetValue::Clear(TVMRetValue *this)

{
  int *piVar1;
  code *pcVar2;
  long lVar3;
  undefined8 *puVar4;
  
  switch((this->super_TVMPODValue_).type_code_) {
  case 4:
    goto switchD_00120f36_caseD_4;
  case 8:
  case 9:
    lVar3 = (this->super_TVMPODValue_).value_.v_int64;
    LOCK();
    piVar1 = (int *)(lVar3 + 4);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if ((*piVar1 == 0) && (pcVar2 = *(code **)(lVar3 + 8), pcVar2 != (code *)0x0)) {
LAB_00120f7d:
      (*pcVar2)(lVar3);
    }
    break;
  case 10:
    puVar4 = (undefined8 *)(this->super_TVMPODValue_).value_.v_handle;
    if ((puVar4 != (undefined8 *)0x0) && ((code *)puVar4[2] != (code *)0x0)) {
      (*(code *)puVar4[2])(puVar4,puVar4,3);
    }
    goto LAB_00120f9f;
  case 0xb:
  case 0xc:
    puVar4 = (undefined8 *)(this->super_TVMPODValue_).value_.v_handle;
    if ((puVar4 != (undefined8 *)0x0) && ((undefined8 *)*puVar4 != puVar4 + 2)) {
      operator_delete((undefined8 *)*puVar4);
    }
LAB_00120f9f:
    operator_delete(puVar4);
    break;
  case 0xd:
    lVar3 = (this->super_TVMPODValue_).value_.v_int64;
    LOCK();
    piVar1 = (int *)(lVar3 + -0xc);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if ((*piVar1 == 0) && (pcVar2 = *(code **)(lVar3 + -8), pcVar2 != (code *)0x0)) {
      lVar3 = lVar3 + -0x10;
      goto LAB_00120f7d;
    }
  }
  (this->super_TVMPODValue_).type_code_ = 4;
switchD_00120f36_caseD_4:
  return;
}

Assistant:

void Clear() {
    if (type_code_ == kTVMNullptr) return;
    switch (type_code_) {
      case kTVMStr: case kTVMBytes: delete ptr<std::string>(); break;
      case kTVMPackedFuncHandle: delete ptr<PackedFunc>(); break;
      case kTVMNDArrayHandle: {
        NDArray::FFIDecRef(static_cast<TVMArrayHandle>(value_.v_handle));
        break;
      }
      case kTVMModuleHandle: {
        static_cast<Object*>(value_.v_handle)->DecRef();
        break;
      }
      case kTVMObjectHandle: {
        static_cast<Object*>(value_.v_handle)->DecRef();
        break;
      }
    }
    type_code_ = kTVMNullptr;
  }